

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

bool __thiscall cmMakefile::PlatformIsAppleIos(cmMakefile *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  char *pcVar3;
  long lVar4;
  long *plVar5;
  long lVar6;
  long *plVar7;
  char *__s;
  ulong uVar8;
  size_type *psVar9;
  long *plVar10;
  bool bVar11;
  bool bVar12;
  string sdkRoot;
  string embedded [6];
  string local_158;
  long *local_138;
  long local_130;
  long local_128;
  long lStack_120;
  long *local_118 [2];
  long local_108 [2];
  string local_f8;
  undefined1 *local_d8 [2];
  undefined1 local_c8 [16];
  undefined1 *local_b8 [2];
  undefined1 local_a8 [16];
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  long *local_58 [2];
  long local_48 [3];
  
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  local_158._M_string_length = 0;
  local_158.field_2._M_local_buf[0] = '\0';
  paVar1 = &local_f8.field_2;
  local_f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"CMAKE_OSX_SYSROOT","");
  pcVar3 = GetDefinition(this,&local_f8);
  sVar2 = local_158._M_string_length;
  __s = "";
  if (pcVar3 != (char *)0x0) {
    __s = pcVar3;
  }
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)&local_158,0,(char *)sVar2,(ulong)__s);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  cmsys::SystemTools::LowerCase(&local_f8,&local_158);
  std::__cxx11::string::operator=((string *)&local_158,(string *)&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  local_f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"appletvos","");
  local_d8[0] = local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"appletvsimulator","");
  local_b8[0] = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"iphoneos","");
  local_98[0] = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"iphonesimulator","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"watchos","");
  plVar10 = local_48;
  local_58[0] = plVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"watchsimulator","");
  bVar11 = true;
  psVar9 = &local_f8._M_string_length;
  uVar8 = 0;
  do {
    lVar4 = std::__cxx11::string::find
                      ((char *)&local_158,(ulong)(((string *)(psVar9 + -1))->_M_dataplus)._M_p,0);
    bVar12 = true;
    if (lVar4 != 0) {
      local_118[0] = local_108;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"/","");
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)local_118,
                                  (ulong)(((string *)(psVar9 + -1))->_M_dataplus)._M_p);
      local_138 = &local_128;
      plVar7 = plVar5 + 2;
      if ((long *)*plVar5 == plVar7) {
        local_128 = *plVar7;
        lStack_120 = plVar5[3];
      }
      else {
        local_128 = *plVar7;
        local_138 = (long *)*plVar5;
      }
      local_130 = plVar5[1];
      *plVar5 = (long)plVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      lVar6 = std::__cxx11::string::find((char *)&local_158,(ulong)local_138,0);
      bVar12 = lVar6 != -1;
    }
    if (lVar4 != 0) {
      if (local_138 != &local_128) {
        operator_delete(local_138,local_128 + 1);
      }
      if (local_118[0] != local_108) {
        operator_delete(local_118[0],local_108[0] + 1);
      }
    }
    if (bVar12) break;
    bVar11 = uVar8 < 5;
    uVar8 = uVar8 + 1;
    psVar9 = psVar9 + 4;
  } while (uVar8 != 6);
  lVar4 = -0xc0;
  do {
    if (plVar10 != (long *)plVar10[-2]) {
      operator_delete((long *)plVar10[-2],*plVar10 + 1);
    }
    plVar10 = plVar10 + -4;
    lVar4 = lVar4 + 0x20;
  } while (lVar4 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,
                    CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,
                             local_158.field_2._M_local_buf[0]) + 1);
  }
  return bVar11;
}

Assistant:

bool cmMakefile::PlatformIsAppleIos() const
{
  std::string sdkRoot;
  sdkRoot = this->GetSafeDefinition("CMAKE_OSX_SYSROOT");
  sdkRoot = cmSystemTools::LowerCase(sdkRoot);

  const std::string embedded[] =
    {
    "appletvos", "appletvsimulator",
    "iphoneos", "iphonesimulator",
    "watchos", "watchsimulator",
    };

  for(size_t i = 0; i < sizeof(embedded) / sizeof(embedded[0]); ++i)
    {
    if(sdkRoot.find(embedded[i]) == 0 ||
       sdkRoot.find(std::string("/") + embedded[i]) != std::string::npos)
      {
      return true;
      }
    }

   return false;
}